

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

ssize_t readn(int fd,void *buff,size_t n)

{
  int *piVar1;
  void *local_48;
  char *ptr;
  ssize_t readSum;
  ssize_t nread;
  size_t nleft;
  size_t n_local;
  void *buff_local;
  int fd_local;
  
  ptr = (char *)0x0;
  local_48 = buff;
  nread = n;
  do {
    if (nread == 0) {
      return (ssize_t)ptr;
    }
    readSum = read(fd,local_48,nread);
    if (readSum < 0) {
      piVar1 = __errno_location();
      if (*piVar1 != 4) {
        piVar1 = __errno_location();
        if (*piVar1 != 0xb) {
          return -1;
        }
        return (ssize_t)ptr;
      }
      readSum = 0;
    }
    else if (readSum == 0) {
      return (ssize_t)ptr;
    }
    ptr = ptr + readSum;
    nread = nread - readSum;
    local_48 = (void *)(readSum + (long)local_48);
  } while( true );
}

Assistant:

ssize_t readn(int fd, void *buff, size_t n) {
  size_t nleft = n;
  ssize_t nread = 0;
  ssize_t readSum = 0;
  char *ptr = (char *)buff;
  while (nleft > 0) {
    if ((nread = read(fd, ptr, nleft)) < 0) {
      if (errno == EINTR)
        nread = 0;
      else if (errno == EAGAIN) {
        return readSum;
      } else {
        return -1;
      }
    } else if (nread == 0)
      break;
    readSum += nread;
    nleft -= nread;
    ptr += nread;
  }
  return readSum;
}